

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::overhull
              (Plane *planes,int planes_count,float3 *verts,int verts_count,int maxplanes,
              float3 **verts_out,int *verts_count_out,int **faces_out,int *faces_count_out,
              float inflate)

{
  Array<ConvexDecomposition::ConvexH::HalfEdge> *pAVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  float3 *pfVar6;
  Plane *pPVar7;
  HalfEdge *__ptr;
  float3 *pfVar8;
  undefined8 uVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  ConvexH *convex;
  ConvexH *convex_00;
  int *piVar14;
  int iVar15;
  long lVar16;
  char *__function;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long in_R10;
  long in_R11;
  ConvexH *tmp;
  bool bVar22;
  undefined1 auVar24 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float3 local_50;
  float3 local_40;
  undefined1 auVar23 [32];
  
  auVar27._4_60_ = in_register_00001204;
  auVar27._0_4_ = inflate;
  iVar12 = 0;
  if (3 < verts_count) {
    uVar3 = verts->x;
    uVar4 = verts->y;
    auVar37._4_4_ = uVar4;
    auVar37._0_4_ = uVar3;
    auVar37._8_8_ = 0;
    auVar36 = ZEXT464((uint)verts->z);
    lVar16 = 0;
    auVar33 = ZEXT416((uint)verts->z);
    auVar34 = auVar37;
    do {
      puVar2 = (uint *)((long)&verts->z + lVar16);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)((long)&verts->x + lVar16);
      lVar16 = lVar16 + 0xc;
      auVar38 = ZEXT416(*puVar2);
      auVar35 = vminss_avx(auVar36._0_16_,auVar38);
      auVar36 = ZEXT1664(auVar35);
      auVar37 = vminps_avx(auVar37,auVar39);
      auVar34 = vmaxps_avx(auVar34,auVar39);
      auVar33 = vmaxss_avx(auVar33,auVar38);
    } while ((ulong)(uint)verts_count * 0xc != lVar16);
    auVar38._4_4_ = inflate;
    auVar38._0_4_ = inflate;
    auVar38._8_4_ = inflate;
    auVar38._12_4_ = inflate;
    local_40.z = auVar35._0_4_ - inflate;
    auVar37 = vsubps_avx(auVar37,auVar38);
    auVar35._0_4_ = auVar34._0_4_ + inflate;
    auVar35._4_4_ = auVar34._4_4_ + inflate;
    auVar35._8_4_ = auVar34._8_4_ + inflate;
    auVar35._12_4_ = auVar34._12_4_ + inflate;
    local_50.z = auVar33._0_4_ + inflate;
    if (planes_count <= maxplanes) {
      maxplanes = planes_count;
    }
    if (0 < planes_count) {
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar26 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar27 = vbroadcastss_avx512f(auVar27._0_16_);
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vpbroadcastq_avx512f();
      uVar13 = (ulong)(planes_count + 0xfU & 0xfffffff0);
      do {
        auVar30 = vpsllq_avx512f(auVar36,4);
        uVar19 = vpcmpuq_avx512f(auVar36,auVar29,2);
        auVar31 = vpsllq_avx512f(auVar25,4);
        uVar10 = vpcmpuq_avx512f(auVar25,auVar29,2);
        auVar25 = vpaddq_avx512f(auVar25,auVar26);
        auVar36 = vpaddq_avx512f(auVar36,auVar26);
        uVar13 = uVar13 - 0x10;
        auVar30 = vpaddq_avx512f(auVar28,auVar30);
        auVar31 = vpaddq_avx512f(auVar28,auVar31);
        auVar23 = vgatherqps_avx512f(*(undefined8 *)(in_R11 + 0xc));
        auVar24._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar23._8_8_;
        auVar24._0_8_ = (ulong)((byte)uVar19 & 1) * auVar23._0_8_;
        auVar24._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar23._16_8_;
        auVar24._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar23._24_8_;
        auVar23 = vgatherqps_avx512f(*(undefined8 *)(in_R10 + 0xc));
        auVar32 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1) * auVar23._24_8_,
                                                CONCAT816((ulong)((byte)(uVar10 >> 2) & 1) *
                                                          auVar23._16_8_,
                                                          CONCAT88((ulong)((byte)(uVar10 >> 1) & 1)
                                                                   * auVar23._8_8_,
                                                                   (ulong)((byte)uVar10 & 1) *
                                                                   auVar23._0_8_)))),auVar24,1);
        auVar32 = vsubps_avx512f(auVar32,auVar27);
        vscatterqps_avx512f(ZEXT864(0xc) + auVar31,uVar10,auVar32._0_32_);
        in_ZmmResult._32_32_ = auVar32._32_32_;
        in_ZmmResult._0_32_ = vextractf64x4_avx512f(auVar32,1);
        vscatterqps_avx512f(ZEXT864(0xc) + auVar30,uVar19,in_ZmmResult._0_32_);
      } while (uVar13 != 0);
    }
    auVar34 = vsubps_avx(auVar35,auVar37);
    local_40._0_8_ = vmovlps_avx(auVar37);
    local_50._0_8_ = vmovlps_avx(auVar35);
    auVar33._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar33._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar33._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar33._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar34 = vhaddps_avx(auVar33,auVar33);
    auVar34 = ZEXT416((uint)((local_50.z - local_40.z) * (local_50.z - local_40.z) + auVar34._0_4_))
    ;
    auVar34 = vsqrtss_avx(auVar34,auVar34);
    planetestepsilon = auVar34._0_4_ * 0.001;
    convex = ConvexHMakeCube(&local_40,&local_50);
    if (maxplanes != 0) {
      do {
        if (planes_count < 1) {
          auVar27 = ZEXT864(0);
          uVar18 = 0;
        }
        else {
          uVar20 = (convex->vertices).count;
          auVar27 = ZEXT864(0);
          uVar19 = 0;
          uVar13 = 0;
          do {
            auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
            if (0 < (int)uVar20) {
              pfVar6 = (convex->vertices).element;
              lVar16 = 0;
              do {
                auVar33 = vfmadd231ss_fma(ZEXT416((uint)(planes[uVar19].normal.y *
                                                        *(float *)((long)&pfVar6->y + lVar16))),
                                          ZEXT416((uint)planes[uVar19].normal.x),
                                          ZEXT416(*(uint *)((long)&pfVar6->x + lVar16)));
                auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)planes[uVar19].normal.z),
                                          ZEXT416(*(uint *)((long)&pfVar6->z + lVar16)));
                lVar16 = lVar16 + 0xc;
                auVar33 = vmaxss_avx(auVar36._0_16_,
                                     ZEXT416((uint)(planes[uVar19].dist + auVar33._0_4_)));
                auVar36 = ZEXT1664(auVar33);
              } while ((ulong)uVar20 * 0xc != lVar16);
            }
            bVar22 = uVar19 == 0;
            bVar11 = auVar27._0_4_ < auVar36._0_4_;
            if (bVar11 || bVar22) {
              uVar13 = uVar19 & 0xffffffff;
            }
            uVar18 = (uint)uVar13;
            uVar19 = uVar19 + 1;
            auVar25._16_48_ = in_ZmmResult._16_48_;
            auVar25._0_16_ = auVar27._0_16_;
            in_ZmmResult._4_60_ = auVar25._4_60_;
            in_ZmmResult._0_4_ =
                 (uint)(bVar11 || bVar22) * (int)auVar36._0_4_ +
                 (uint)(!bVar11 && !bVar22) * (int)auVar27._0_4_;
            auVar27 = ZEXT1664(in_ZmmResult._0_16_);
          } while (uVar19 != (uint)planes_count);
        }
        if (auVar27._0_4_ <= auVar34._0_4_ * 0.025) {
          uVar18 = 0xffffffff;
        }
        if ((((int)uVar18 < 0) ||
            (convex_00 = ConvexHCrop(convex,planes + uVar18), convex_00 == (ConvexH *)0x0)) ||
           (iVar12 = AssertIntact(convex_00), iVar12 == 0)) break;
        pPVar7 = (convex->facets).element;
        if (pPVar7 != (Plane *)0x0) {
          free(pPVar7);
        }
        (convex->facets).element = (Plane *)0x0;
        (convex->facets).count = 0;
        (convex->facets).array_size = 0;
        __ptr = (convex->edges).element;
        if (__ptr != (HalfEdge *)0x0) {
          free(__ptr);
        }
        (convex->edges).element = (HalfEdge *)0x0;
        (convex->edges).count = 0;
        (convex->edges).array_size = 0;
        pfVar6 = (convex->vertices).element;
        if (pfVar6 != (float3 *)0x0) {
          free(pfVar6);
        }
        maxplanes = maxplanes + -1;
        operator_delete(convex,0x30);
        convex = convex_00;
      } while (maxplanes != 0);
    }
    iVar12 = AssertIntact(convex);
    if (iVar12 == 0) {
      __assert_fail("AssertIntact(*c)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa6f,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    pAVar1 = &convex->edges;
    piVar14 = (int *)malloc(((long)(convex->edges).count + (long)(convex->facets).count) * 4 + 4);
    iVar17 = 1;
    *faces_out = piVar14;
    *faces_count_out = 1;
    *piVar14 = -1;
    iVar15 = 0;
    iVar12 = (convex->edges).count;
    if (0 < iVar12) {
      uVar18 = 0;
      do {
        uVar20 = 1;
        if ((int)(uVar18 + 1) < iVar12) {
          uVar20 = iVar12 - uVar18;
          uVar13 = (ulong)(uVar18 + 1);
          lVar16 = -1;
          do {
            if (((int)uVar13 < 0) || (iVar12 <= (int)uVar13)) goto LAB_009082a4;
            if (pAVar1->element[uVar18].p != pAVar1->element[uVar13].p) {
              uVar20 = -(int)lVar16;
              break;
            }
            lVar16 = lVar16 + -1;
            uVar13 = uVar13 + 1;
          } while (-lVar16 != (ulong)uVar20);
        }
        lVar21 = (long)iVar17;
        iVar17 = iVar17 + 1;
        lVar16 = (long)iVar17;
        *faces_count_out = iVar17;
        piVar14[lVar21] = uVar20;
        lVar21 = 0;
        do {
          if ((convex->edges).count <= (int)(uVar18 + (int)lVar21)) goto LAB_009082a4;
          iVar17 = iVar17 + 1;
          bVar5 = pAVar1->element[(ulong)uVar18 + lVar21].v;
          *faces_count_out = iVar17;
          piVar14[lVar16 + lVar21] = (uint)bVar5;
          lVar21 = lVar21 + 1;
        } while (uVar20 != (uint)lVar21);
        iVar12 = (convex->edges).count;
        uVar18 = uVar18 + (uint)lVar21;
        iVar15 = iVar15 + 1;
      } while ((int)uVar18 < iVar12);
    }
    *piVar14 = iVar15;
    if (iVar15 != (convex->facets).count) {
      __assert_fail("k==c->facets.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa83,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    if (iVar17 != iVar15 + 1 + (convex->edges).count) {
      __assert_fail("faces_count_out == 1+c->facets.count+c->edges.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa84,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    *verts_out = (convex->vertices).element;
    uVar18 = (convex->vertices).count;
    uVar13 = (ulong)uVar18;
    *verts_count_out = uVar18;
    if (0 < (int)uVar18) {
      lVar16 = 0;
      lVar21 = 0;
      do {
        if ((int)uVar13 <= lVar21) {
          __function = 
          "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
          ;
          goto LAB_009082b9;
        }
        pfVar6 = (convex->vertices).element;
        pfVar8 = *verts_out;
        lVar21 = lVar21 + 1;
        uVar9 = *(undefined8 *)((long)&pfVar6->x + lVar16);
        *(undefined4 *)((long)&pfVar8->z + lVar16) = *(undefined4 *)((long)&pfVar6->z + lVar16);
        *(undefined8 *)((long)&pfVar8->x + lVar16) = uVar9;
        lVar16 = lVar16 + 0xc;
        uVar13 = (ulong)(convex->vertices).count;
      } while (lVar21 < (long)uVar13);
    }
    (convex->vertices).element = (float3 *)0x0;
    (convex->vertices).count = 0;
    (convex->vertices).array_size = 0;
    pPVar7 = (convex->facets).element;
    if (pPVar7 != (Plane *)0x0) {
      free(pPVar7);
    }
    (convex->facets).element = (Plane *)0x0;
    (convex->facets).count = 0;
    (convex->facets).array_size = 0;
    if (pAVar1->element != (HalfEdge *)0x0) {
      free(pAVar1->element);
    }
    pAVar1->element = (HalfEdge *)0x0;
    (convex->edges).count = 0;
    (convex->edges).array_size = 0;
    pfVar6 = (convex->vertices).element;
    if (pfVar6 != (float3 *)0x0) {
      free(pfVar6);
    }
    operator_delete(convex,0x30);
    iVar12 = 1;
  }
  return iVar12;
LAB_009082a4:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
  ;
LAB_009082b9:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

int overhull(Plane *planes,int planes_count,float3 *verts, int verts_count,int maxplanes, 
			 float3 *&verts_out, int &verts_count_out,  int *&faces_out, int &faces_count_out ,float inflate)
{
	int i,j;
	if(verts_count <4) return 0;
	maxplanes = Min(maxplanes,planes_count);
	float3 bmin(verts[0]),bmax(verts[0]);
	for(i=0;i<verts_count;i++) 
	{
		bmin = VectorMin(bmin,verts[i]);
		bmax = VectorMax(bmax,verts[i]);
	}
//	float diameter = magnitude(bmax-bmin);
//	inflate *=diameter;   // RELATIVE INFLATION
	bmin -= float3(inflate,inflate,inflate);
	bmax += float3(inflate,inflate,inflate);
	for(i=0;i<planes_count;i++)
	{
		planes[i].dist -= inflate;
	}
	float3 emin = bmin; // VectorMin(bmin,float3(0,0,0));
	float3 emax = bmax; // VectorMax(bmax,float3(0,0,0));
	float epsilon  = magnitude(emax-emin) * 0.025f;
	planetestepsilon = magnitude(emax-emin) * PAPERWIDTH;
	// todo: add bounding cube planes to force bevel. or try instead not adding the diameter expansion ??? must think.
	// ConvexH *convex = ConvexHMakeCube(bmin - float3(diameter,diameter,diameter),bmax+float3(diameter,diameter,diameter));
	ConvexH *c = ConvexHMakeCube(REAL3(bmin),REAL3(bmax)); 
	int k;
	while(maxplanes-- && (k=candidateplane(planes,planes_count,c,epsilon))>=0)
	{
		ConvexH *tmp = c;
		c = ConvexHCrop(*tmp,planes[k]);
		if(c==NULL) {c=tmp; break;} // might want to debug this case better!!!
		if(!AssertIntact(*c)) {c=tmp; break;} // might want to debug this case better too!!!
		delete tmp;
	}

	assert(AssertIntact(*c));
	//return c;
	faces_out = (int*)malloc(sizeof(int)*(1+c->facets.count+c->edges.count));     // new int[1+c->facets.count+c->edges.count];
	faces_count_out=0;
	i=0;
	faces_out[faces_count_out++]=-1;
	k=0;
	while(i<c->edges.count)
	{
		j=1;
		while(j+i<c->edges.count && c->edges[i].p==c->edges[i+j].p) { j++; }
		faces_out[faces_count_out++]=j;
		while(j--)
		{
			faces_out[faces_count_out++] = c->edges[i].v;
			i++;
		}
		k++;
	}
	faces_out[0]=k; // number of faces.
	assert(k==c->facets.count);
	assert(faces_count_out == 1+c->facets.count+c->edges.count);
	verts_out = c->vertices.element; // new float3[c->vertices.count]; 
	verts_count_out = c->vertices.count;
	for(i=0;i<c->vertices.count;i++)
	{
		verts_out[i] = float3(c->vertices[i]);
	}
	c->vertices.count=c->vertices.array_size=0;	c->vertices.element=NULL;
	delete c;
	return 1;
}